

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

void get_subformats_context
               (FMFormat_conflict fmformat,FMFormat_conflict **format_list_p,int *format_count_p,
               FMFormat_conflict **stack_p)

{
  long lVar1;
  void *pvVar2;
  long *in_RCX;
  FMFormat_conflict **in_RDX;
  FMFormat_conflict in_RSI;
  long in_RDI;
  int j;
  int i;
  FMFormat_conflict subformat;
  FMFormat_conflict *stack;
  int stack_depth;
  int field;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  int in_stack_ffffffffffffffc4;
  undefined8 local_38;
  undefined8 local_30;
  int iVar5;
  int iVar6;
  
  iVar5 = 0;
  while (*(long *)(*in_RCX + (long)iVar5 * 8) != 0) {
    iVar5 = iVar5 + 1;
  }
  local_30 = ffs_realloc((void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  *in_RCX = (long)local_30;
  *(long *)((long)local_30 + (long)iVar5 * 8) = in_RDI;
  *(undefined8 *)((long)local_30 + (long)(iVar5 + 1) * 8) = 0;
  for (iVar6 = 0; iVar6 < *(int *)(in_RDI + 0x44); iVar6 = iVar6 + 1) {
    local_38 = *(long *)(*(long *)(in_RDI + 0x88) + (long)iVar6 * 8);
    if (local_38 != 0) {
      iVar4 = 0;
      while( true ) {
        uVar3 = false;
        if (*(long *)((long)local_30 + (long)iVar4 * 8) != local_38) {
          uVar3 = *(long *)((long)local_30 + (long)iVar4 * 8) != 0;
        }
        if ((bool)uVar3 == false) break;
        iVar4 = iVar4 + 1;
      }
      if (*(long *)((long)local_30 + (long)iVar4 * 8) != local_38) {
        get_subformats_context
                  (in_RSI,in_RDX,(int *)in_RCX,(FMFormat_conflict **)CONCAT44(iVar6,iVar5));
        local_30 = (void *)*in_RCX;
      }
      pvVar2 = ffs_realloc((void *)CONCAT44(in_stack_ffffffffffffffc4,iVar4),
                           CONCAT17(uVar3,in_stack_ffffffffffffffb8));
      *(void **)in_RSI = pvVar2;
      for (in_stack_ffffffffffffffc4 = 0; in_stack_ffffffffffffffc4 < *(int *)in_RDX;
          in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 + 1) {
        if (*(long *)(*(long *)in_RSI + (long)in_stack_ffffffffffffffc4 * 8) == local_38) {
          local_38 = 0;
        }
      }
      if (local_38 != 0) {
        lVar1 = *(long *)in_RSI;
        iVar4 = *(int *)in_RDX;
        *(int *)in_RDX = iVar4 + 1;
        *(long *)(lVar1 + (long)iVar4 * 8) = local_38;
      }
    }
  }
  return;
}

Assistant:

static
void
get_subformats_context(FMFormat fmformat, FMFormat **format_list_p, int *format_count_p,
		       FMFormat **stack_p)
{
    int field;
    int stack_depth = 0;
    FMFormat *stack = *stack_p;
    while(stack[stack_depth] != NULL) stack_depth++;
    *stack_p = stack = realloc(stack, sizeof(stack[0]) * (stack_depth + 2));
    stack[stack_depth] = fmformat;
    stack[stack_depth+1] = NULL;
    for (field = 0; field < fmformat->field_count; field++) {
	FMFormat subformat = fmformat->field_subformats[field];
	if (subformat != NULL) {
	    int i;
	    int j = 0;
	    while((stack[j] != subformat) && (stack[j] != NULL)) j++;
	    if (stack[j] != subformat) {
		/* if we're not already getting this subformat, recurse */
		get_subformats_context(subformat, format_list_p, format_count_p, stack_p);
		/* stack might have been realloc'd */
		stack = *stack_p;
	    }
	    *format_list_p = realloc(*format_list_p,
			       sizeof(FMFormat) * (*format_count_p + 2));
	    for (i=0; i< *format_count_p; i++) {
		if ((*format_list_p)[i] == subformat) {
		    /* don't add it if it's already there */
		    subformat = NULL;
		}
	    }
	    if (subformat != NULL) {
		(*format_list_p)[(*format_count_p)++] = subformat;
	    }
	}
    }
}